

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLUri.cpp
# Opt level: O1

void xercesc_4_0::XMLUri::isConformantUserInfo(XMLCh *userInfo,MemoryManager *manager)

{
  short *psVar1;
  XMLCh *pXVar2;
  XMLCh theChar;
  bool bVar3;
  int iVar4;
  MalformedURLException *pMVar5;
  long lVar6;
  XMLCh *pXVar7;
  XMLCh value1 [4];
  XMLCh local_38;
  XMLCh local_36;
  XMLCh local_34;
  undefined2 local_32;
  
  if (userInfo != (XMLCh *)0x0) {
    theChar = *userInfo;
    pXVar7 = userInfo;
    while (theChar != L'\0') {
      bVar3 = XMLString::isAlphaNum(theChar);
      lVar6 = 2;
      if (((!bVar3) && (iVar4 = XMLString::indexOf((XMLCh *)MARK_CHARACTERS,theChar), iVar4 == -1))
         && (iVar4 = XMLString::indexOf((XMLCh *)USERINFO_CHARACTERS,*pXVar7), iVar4 == -1)) {
        if (*pXVar7 != L'%') {
          pMVar5 = (MalformedURLException *)__cxa_allocate_exception(0x30);
          MalformedURLException::MalformedURLException
                    (pMVar5,
                     "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLUri.cpp"
                     ,0x5b7,XMLNUM_URI_Component_Invalid_Char,(XMLCh *)errMsg_USERINFO,userInfo,
                     (XMLCh *)0x0,(XMLCh *)0x0,manager);
          __cxa_throw(pMVar5,&MalformedURLException::typeinfo,XMLException::~XMLException);
        }
        lVar6 = 0;
        do {
          psVar1 = (short *)((long)pXVar7 + lVar6);
          lVar6 = lVar6 + 2;
        } while (*psVar1 != 0);
        if ((0xfffffffffffffffc < (lVar6 >> 1) - 4U) ||
           (bVar3 = XMLString::isHex(pXVar7[1]), !bVar3)) {
LAB_0025bdc6:
          local_38 = L'%';
          local_36 = pXVar7[1];
          local_34 = pXVar7[2];
          local_32 = 0;
          pMVar5 = (MalformedURLException *)__cxa_allocate_exception(0x30);
          MalformedURLException::MalformedURLException
                    (pMVar5,
                     "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLUri.cpp"
                     ,0x5ae,XMLNUM_URI_Component_Invalid_EscapeSequence,(XMLCh *)errMsg_USERINFO,
                     &local_38,(XMLCh *)0x0,(XMLCh *)0x0,manager);
          __cxa_throw(pMVar5,&MalformedURLException::typeinfo,XMLException::~XMLException);
        }
        bVar3 = XMLString::isHex(pXVar7[2]);
        lVar6 = 6;
        if (!bVar3) goto LAB_0025bdc6;
      }
      pXVar2 = (XMLCh *)((long)pXVar7 + lVar6);
      pXVar7 = (XMLCh *)((long)pXVar7 + lVar6);
      theChar = *pXVar2;
    }
  }
  return;
}

Assistant:

void XMLUri::isConformantUserInfo(const XMLCh* const userInfo
                                  , MemoryManager* const manager)
{
	if ( !userInfo )
        return;

    const XMLCh* tmpStr = userInfo;
    while (*tmpStr)
    {
        if ( isUnreservedCharacter(*tmpStr) ||
            (XMLString::indexOf(USERINFO_CHARACTERS, *tmpStr) != -1))
        {
            tmpStr++;
        }
        else if (*tmpStr == chPercent)               // '%'
        {
            if (XMLString::stringLen(tmpStr) >= 3
                && XMLString::isHex(*(tmpStr+1))     // 1st hex
                && XMLString::isHex(*(tmpStr+2))  )  // 2nd hex
            {
                tmpStr+=3;
            }
            else
            {
                XMLCh value1[4];
                value1[0] = chPercent;
                value1[1] = *(tmpStr+1);
                value1[2] = *(tmpStr+2);
                value1[3] = chNull;

                ThrowXMLwithMemMgr2(MalformedURLException
                        , XMLExcepts::XMLNUM_URI_Component_Invalid_EscapeSequence
                        , errMsg_USERINFO
                        , value1
                        , manager);
            }
        }
        else
        {
            ThrowXMLwithMemMgr2(MalformedURLException
                    , XMLExcepts::XMLNUM_URI_Component_Invalid_Char
                    , errMsg_USERINFO
                    , userInfo
                    , manager);
        }
    } //while

    return;
}